

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

bool __thiscall reflection::Schema::Verify(Schema *this,Verifier *verifier)

{
  bool bVar1;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar2;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar3;
  String *pSVar4;
  Object *table;
  Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *pVVar5;
  Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *pVVar6;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    pVVar2 = objects(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::
            VerifyVector<flatbuffers::Offset<reflection::Object>,_unsigned_int>(verifier,pVVar2);
    if (bVar1) {
      pVVar2 = objects(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Object>
                        (verifier,pVVar2);
      if ((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                            (&this->super_Table,verifier,6), bVar1)) {
        pVVar3 = enums(this);
        bVar1 = flatbuffers::VerifierTemplate<false>::
                VerifyVector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>(verifier,pVVar3);
        if (bVar1) {
          pVVar3 = enums(this);
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Enum>
                            (verifier,pVVar3);
          if ((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8),
             bVar1)) {
            pSVar4 = file_ident(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
            if ((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,10), bVar1)) {
              pSVar4 = file_ext(this);
              bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
              if ((bVar1) &&
                 (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                    (&this->super_Table,verifier,0xc), bVar1)) {
                table = root_table(this);
                bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTable<reflection::Object>
                                  (verifier,table);
                if ((bVar1) &&
                   (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                      (&this->super_Table,verifier,0xe), bVar1)) {
                  pVVar5 = services(this);
                  bVar1 = flatbuffers::VerifierTemplate<false>::
                          VerifyVector<flatbuffers::Offset<reflection::Service>,_unsigned_int>
                                    (verifier,pVVar5);
                  if (bVar1) {
                    pVVar5 = services(this);
                    bVar1 = flatbuffers::VerifierTemplate<false>::
                            VerifyVectorOfTables<reflection::Service>(verifier,pVVar5);
                    if (((bVar1) &&
                        (bVar1 = flatbuffers::Table::VerifyField<unsigned_long>
                                           (&this->super_Table,verifier,0x10,8), bVar1)) &&
                       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                          (&this->super_Table,verifier,0x12), bVar1)) {
                      pVVar6 = fbs_files(this);
                      bVar1 = flatbuffers::VerifierTemplate<false>::
                              VerifyVector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>
                                        (verifier,pVVar6);
                      if (bVar1) {
                        pVVar6 = fbs_files(this);
                        bVar1 = flatbuffers::VerifierTemplate<false>::
                                VerifyVectorOfTables<reflection::SchemaFile>(verifier,pVVar6);
                        if (bVar1) {
                          verifier->depth_ = verifier->depth_ - 1;
                          return true;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_OBJECTS) &&
           verifier.VerifyVector(objects()) &&
           verifier.VerifyVectorOfTables(objects()) &&
           VerifyOffsetRequired(verifier, VT_ENUMS) &&
           verifier.VerifyVector(enums()) &&
           verifier.VerifyVectorOfTables(enums()) &&
           VerifyOffset(verifier, VT_FILE_IDENT) &&
           verifier.VerifyString(file_ident()) &&
           VerifyOffset(verifier, VT_FILE_EXT) &&
           verifier.VerifyString(file_ext()) &&
           VerifyOffset(verifier, VT_ROOT_TABLE) &&
           verifier.VerifyTable(root_table()) &&
           VerifyOffset(verifier, VT_SERVICES) &&
           verifier.VerifyVector(services()) &&
           verifier.VerifyVectorOfTables(services()) &&
           VerifyField<uint64_t>(verifier, VT_ADVANCED_FEATURES, 8) &&
           VerifyOffset(verifier, VT_FBS_FILES) &&
           verifier.VerifyVector(fbs_files()) &&
           verifier.VerifyVectorOfTables(fbs_files()) &&
           verifier.EndTable();
  }